

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O1

kStatus __thiscall
gnilk::Log::Error<char_const*,char_const*>(Log *this,char *arguments,char *arguments_1)

{
  int iVar1;
  size_t sVar2;
  kStatus kVar3;
  basic_string_view<char> format;
  basic_format_args<fmt::v10::basic_printf_context<char>_> args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  string local_288;
  char *local_268 [2];
  buffer<char> local_258;
  char local_238 [536];
  
  kVar3 = kFiltered;
  if ((this->isEnabled == true) && ((int)this->logLevelThreshold < 0x191)) {
    sVar2 = strlen(arguments);
    local_258.size_ = 0;
    local_258._vptr_buffer = (_func_int **)&PTR_grow_001e1690;
    local_258.capacity_ = 500;
    format.size_ = sVar2;
    format.data_ = arguments;
    args.field_1.values_ = (value<fmt::v10::basic_printf_context<char>_> *)local_268;
    args.desc_ = 0xc;
    local_268[0] = arguments_1;
    local_258.ptr_ = local_238;
    ::fmt::v10::detail::vprintf<char,fmt::v10::basic_printf_context<char>>(&local_258,format,args);
    local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_288,local_258.ptr_,local_258.ptr_ + local_258.size_);
    if (local_258.ptr_ != local_238) {
      operator_delete(local_258.ptr_,local_258.capacity_);
    }
    iVar1 = SendLogMessage(this,kError,&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    kVar3 = (uint)(iVar1 < 1) * 2;
  }
  return kVar3;
}

Assistant:

inline kStatus Error(T... arguments) const {
            if (!(isEnabled && WithinRange(kError))) return kStatus::kFiltered;
            auto str = fmt::sprintf(arguments...);
            return (SendLogMessage(kError, str) > 0) ? kStatus::kOk : kStatus::kSendError;
        }